

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O3

nvpair_t * nvlist_find(nvlist_t *nvl,int type,char *name)

{
  int iVar1;
  char *pcVar2;
  nvpair_t *nvp;
  int *piVar3;
  
  if (nvl == (nvlist_t *)0x0) {
    pcVar2 = "(nvl) != ((void*)0)";
  }
  else {
    if (nvl->nvl_magic == 0x6e766c) {
      if (nvl->nvl_error != 0) {
        __assert_fail("nvl->nvl_error == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                      ,0x144,"nvpair_t *nvlist_find(const nvlist_t *, int, const char *)");
      }
      if ((uint)type < 0xd) {
        nvp = (nvl->nvl_head).tqh_first;
        do {
          if (nvp == (nvpair_t *)0x0) {
            piVar3 = __errno_location();
            *piVar3 = 2;
            return (nvpair_t *)0x0;
          }
          if ((type == 0) || (iVar1 = nvpair_type(nvp), iVar1 == type)) {
            iVar1 = nvl->nvl_flags;
            pcVar2 = nvpair_name(nvp);
            if ((iVar1 & 1) == 0) {
              iVar1 = strcmp(pcVar2,name);
            }
            else {
              iVar1 = strcasecmp(pcVar2,name);
            }
            if (iVar1 == 0) {
              return nvp;
            }
          }
          nvp = nvlist_next_nvpair(nvl,nvp);
        } while( true );
      }
      __assert_fail("type == 0 || (type >= 1 && type <= 12)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                    ,0x146,"nvpair_t *nvlist_find(const nvlist_t *, int, const char *)");
    }
    pcVar2 = "(nvl)->nvl_magic == 0x6e766c";
  }
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                ,0x143,"nvpair_t *nvlist_find(const nvlist_t *, int, const char *)");
}

Assistant:

static nvpair_t *
nvlist_find(const nvlist_t *nvl, int type, const char *name)
{
	nvpair_t *nvp;

	NVLIST_ASSERT(nvl);
	PJDLOG_ASSERT(nvl->nvl_error == 0);
	PJDLOG_ASSERT(type == NV_TYPE_NONE ||
	    (type >= NV_TYPE_FIRST && type <= NV_TYPE_LAST));

	for (nvp = nvlist_first_nvpair(nvl); nvp != NULL;
	    nvp = nvlist_next_nvpair(nvl, nvp)) {
		if (type != NV_TYPE_NONE && nvpair_type(nvp) != type)
			continue;
		if ((nvl->nvl_flags & NV_FLAG_IGNORE_CASE) != 0) {
			if (strcasecmp(nvpair_name(nvp), name) != 0)
				continue;
		} else {
			if (strcmp(nvpair_name(nvp), name) != 0)
				continue;
		}
		break;
	}

	if (nvp == NULL)
		ERRNO_SET(ENOENT);

	return (nvp);
}